

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void gen_pool32axf_nanomips_insn(CPUMIPSState_conflict8 *env,DisasContext_conflict6 *ctx)

{
  TCGContext_conflict6 *tcg_ctx_00;
  uint32_t rt_00;
  uint32_t rs_00;
  uint32_t uVar1;
  uint32_t uVar2;
  TCGv_i64 pTVar3;
  int32_t op1_3;
  TCGv_i64 t0_1;
  TCGv_i64 t0;
  int32_t op1_2;
  int32_t op1_1;
  int32_t op1;
  int rd;
  int rs;
  int rt;
  TCGContext_conflict6 *tcg_ctx;
  DisasContext_conflict6 *ctx_local;
  CPUMIPSState_conflict8 *env_local;
  
  tcg_ctx_00 = ctx->uc->tcg_ctx;
  rt_00 = extract32(ctx->opcode,0x15,5);
  rs_00 = extract32(ctx->opcode,0x10,5);
  uVar1 = extract32(ctx->opcode,0xb,5);
  uVar2 = extract32(ctx->opcode,6,3);
  switch(uVar2) {
  case 1:
    uVar2 = extract32(ctx->opcode,9,3);
    gen_pool32axf_1_nanomips_insn(ctx,uVar2,rt_00,rs_00,uVar1);
    break;
  case 2:
    uVar2 = extract32(ctx->opcode,0xc,2);
    gen_pool32axf_2_nanomips_insn(ctx,uVar2,rt_00,rs_00,uVar1);
    break;
  default:
    generate_exception_end(ctx,0x14);
    break;
  case 4:
    uVar1 = extract32(ctx->opcode,9,7);
    gen_pool32axf_4_nanomips_insn(ctx,uVar1,rt_00,rs_00);
    break;
  case 5:
    uVar1 = extract32(ctx->opcode,9,7);
    switch(uVar1) {
    case 1:
      gen_cp0(env,ctx,0x42000008,0,0);
      break;
    default:
      generate_exception_end(ctx,0x14);
      break;
    case 3:
      gen_cp0(env,ctx,0x42000003,0,0);
      break;
    case 9:
      gen_cp0(env,ctx,0x42000001,0,0);
      break;
    case 0xb:
      gen_cp0(env,ctx,0x42000004,0,0);
      break;
    case 0x11:
      gen_cp0(env,ctx,0x42000002,0,0);
      break;
    case 0x19:
      gen_cp0(env,ctx,0x42000006,0,0);
      break;
    case 0x23:
      check_cp0_enabled(ctx);
      pTVar3 = tcg_temp_new_i64(tcg_ctx_00);
      save_cpu_state(ctx,1);
      gen_helper_di(tcg_ctx_00,pTVar3,tcg_ctx_00->cpu_env);
      gen_store_gpr(tcg_ctx_00,pTVar3,rt_00);
      (ctx->base).is_jmp = DISAS_TARGET_0;
      tcg_temp_free_i64(tcg_ctx_00,pTVar3);
      break;
    case 0x2b:
      check_cp0_enabled(ctx);
      pTVar3 = tcg_temp_new_i64(tcg_ctx_00);
      save_cpu_state(ctx,1);
      gen_helper_ei(tcg_ctx_00,pTVar3,tcg_ctx_00->cpu_env);
      gen_store_gpr(tcg_ctx_00,pTVar3,rt_00);
      (ctx->base).is_jmp = DISAS_TARGET_0;
      tcg_temp_free_i64(tcg_ctx_00,pTVar3);
      break;
    case 0x61:
      gen_cp0(env,ctx,0x42000020,0,0);
      break;
    case 0x70:
      gen_load_srsgpr(tcg_ctx_00,rs_00,rt_00);
      break;
    case 0x71:
      gen_cp0(env,ctx,0x4200001f,0,0);
      break;
    case 0x78:
      gen_store_srsgpr(tcg_ctx_00,rs_00,rt_00);
      break;
    case 0x79:
      gen_cp0(env,ctx,0x42000018,0,0);
    }
    break;
  case 7:
    uVar2 = extract32(ctx->opcode,9,3);
    gen_pool32axf_7_nanomips_insn(ctx,uVar2,rt_00,rs_00,uVar1);
  }
  return;
}

Assistant:

static void gen_pool32axf_nanomips_insn(CPUMIPSState *env, DisasContext *ctx)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    int rt = extract32(ctx->opcode, 21, 5);
    int rs = extract32(ctx->opcode, 16, 5);
    int rd = extract32(ctx->opcode, 11, 5);

    switch (extract32(ctx->opcode, 6, 3)) {
    case NM_POOL32AXF_1:
        {
            int32_t op1 = extract32(ctx->opcode, 9, 3);
            gen_pool32axf_1_nanomips_insn(ctx, op1, rt, rs, rd);
        }
        break;
    case NM_POOL32AXF_2:
        {
            int32_t op1 = extract32(ctx->opcode, 12, 2);
            gen_pool32axf_2_nanomips_insn(ctx, op1, rt, rs, rd);
        }
        break;
    case NM_POOL32AXF_4:
        {
            int32_t op1 = extract32(ctx->opcode, 9, 7);
            gen_pool32axf_4_nanomips_insn(ctx, op1, rt, rs);
        }
        break;
    case NM_POOL32AXF_5:
        switch (extract32(ctx->opcode, 9, 7)) {
        case NM_TLBP:
            gen_cp0(env, ctx, OPC_TLBP, 0, 0);
            break;
        case NM_TLBR:
            gen_cp0(env, ctx, OPC_TLBR, 0, 0);
            break;
        case NM_TLBWI:
            gen_cp0(env, ctx, OPC_TLBWI, 0, 0);
            break;
        case NM_TLBWR:
            gen_cp0(env, ctx, OPC_TLBWR, 0, 0);
            break;
        case NM_TLBINV:
            gen_cp0(env, ctx, OPC_TLBINV, 0, 0);
            break;
        case NM_TLBINVF:
            gen_cp0(env, ctx, OPC_TLBINVF, 0, 0);
            break;
        case NM_DI:
            check_cp0_enabled(ctx);
            {
                TCGv t0 = tcg_temp_new(tcg_ctx);

                save_cpu_state(ctx, 1);
                gen_helper_di(tcg_ctx, t0, tcg_ctx->cpu_env);
                gen_store_gpr(tcg_ctx, t0, rt);
            /* Stop translation as we may have switched the execution mode */
                ctx->base.is_jmp = DISAS_STOP;
                tcg_temp_free(tcg_ctx, t0);
            }
            break;
        case NM_EI:
            check_cp0_enabled(ctx);
            {
                TCGv t0 = tcg_temp_new(tcg_ctx);

                save_cpu_state(ctx, 1);
                gen_helper_ei(tcg_ctx, t0, tcg_ctx->cpu_env);
                gen_store_gpr(tcg_ctx, t0, rt);
            /* Stop translation as we may have switched the execution mode */
                ctx->base.is_jmp = DISAS_STOP;
                tcg_temp_free(tcg_ctx, t0);
            }
            break;
        case NM_RDPGPR:
            gen_load_srsgpr(tcg_ctx, rs, rt);
            break;
        case NM_WRPGPR:
            gen_store_srsgpr(tcg_ctx, rs, rt);
            break;
        case NM_WAIT:
            gen_cp0(env, ctx, OPC_WAIT, 0, 0);
            break;
        case NM_DERET:
            gen_cp0(env, ctx, OPC_DERET, 0, 0);
            break;
        case NM_ERETX:
            gen_cp0(env, ctx, OPC_ERET, 0, 0);
            break;
        default:
            generate_exception_end(ctx, EXCP_RI);
            break;
        }
        break;
    case NM_POOL32AXF_7:
        {
            int32_t op1 = extract32(ctx->opcode, 9, 3);
            gen_pool32axf_7_nanomips_insn(ctx, op1, rt, rs, rd);
        }
        break;
    default:
        generate_exception_end(ctx, EXCP_RI);
        break;
    }
}